

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.cc
# Opt level: O0

NodeData __thiscall
google::protobuf::compiler::cpp::SCCAnalyzer::DFS(SCCAnalyzer *this,Descriptor *descriptor)

{
  Descriptor *pDVar1;
  int iVar2;
  size_type sVar3;
  LogMessage *other;
  mapped_type *pmVar4;
  FieldDescriptor *this_00;
  int *piVar5;
  mapped_type *pmVar6;
  reference ppDVar7;
  NodeData NVar8;
  value_type local_c0;
  Descriptor *scc_desc;
  SCC *scc;
  NodeData child_data_1;
  NodeData child_data;
  Descriptor *child;
  int i;
  NodeData *result;
  byte local_61;
  LogMessage local_60;
  Descriptor *local_28;
  Descriptor *descriptor_local;
  SCCAnalyzer *this_local;
  
  local_28 = descriptor;
  descriptor_local = (Descriptor *)this;
  sVar3 = std::
          map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
          ::count(&this->cache_,&local_28);
  local_61 = 0;
  if (sVar3 != 0) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.cc"
               ,0x29b);
    local_61 = 1;
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (cache_.count(descriptor)) == (0): ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&result + 3),other);
  }
  if ((local_61 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_60);
  }
  pmVar4 = std::
           map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
           ::operator[](&this->cache_,&local_28);
  iVar2 = this->index_;
  this->index_ = iVar2 + 1;
  pmVar4->lowlink = iVar2;
  pmVar4->index = iVar2;
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::push_back(&this->stack_,&local_28);
  for (child._4_4_ = 0; iVar2 = Descriptor::field_count(local_28), child._4_4_ < iVar2;
      child._4_4_ = child._4_4_ + 1) {
    this_00 = Descriptor::field(local_28,child._4_4_);
    child_data._8_8_ = FieldDescriptor::message_type(this_00);
    if ((Descriptor *)child_data._8_8_ != (Descriptor *)0x0) {
      sVar3 = std::
              map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
              ::count(&this->cache_,(key_type *)&child_data.index);
      if (sVar3 == 0) {
        join_0x00000010_0x00000000_ = DFS(this,(Descriptor *)child_data._8_8_);
        piVar5 = std::min<int>(&pmVar4->lowlink,(int *)((long)&child_data.scc + 4));
        pmVar4->lowlink = *piVar5;
      }
      else {
        pmVar6 = std::
                 map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
                 ::operator[](&this->cache_,(key_type *)&child_data.index);
        scc = pmVar6->scc;
        child_data_1.scc = *(SCC **)&pmVar6->index;
        if (scc == (SCC *)0x0) {
          piVar5 = std::min<int>(&pmVar4->lowlink,(int *)&child_data_1);
          pmVar4->lowlink = *piVar5;
        }
      }
    }
  }
  if (pmVar4->index == pmVar4->lowlink) {
    scc_desc = (Descriptor *)CreateSCC(this);
    do {
      ppDVar7 = std::
                vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ::back(&this->stack_);
      local_c0 = *ppDVar7;
      std::
      vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::push_back((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)scc_desc,&local_c0);
      std::
      vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::pop_back(&this->stack_);
      pDVar1 = scc_desc;
      pmVar6 = std::
               map<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::compiler::cpp::SCCAnalyzer::NodeData>_>_>
               ::operator[](&this->cache_,&local_c0);
      pmVar6->scc = (SCC *)pDVar1;
    } while (local_c0 != local_28);
  }
  NVar8.scc = pmVar4->scc;
  NVar8.index = pmVar4->index;
  NVar8.lowlink = pmVar4->lowlink;
  return NVar8;
}

Assistant:

SCCAnalyzer::NodeData SCCAnalyzer::DFS(const Descriptor* descriptor) {
  // Must not have visited already.
  GOOGLE_DCHECK_EQ(cache_.count(descriptor), 0);

  // Mark visited by inserting in map.
  NodeData& result = cache_[descriptor];
  // Initialize data structures.
  result.index = result.lowlink = index_++;
  stack_.push_back(descriptor);

  // Recurse the fields / nodes in graph
  for (int i = 0; i < descriptor->field_count(); i++) {
    const Descriptor* child = descriptor->field(i)->message_type();
    if (child) {
      if (cache_.count(child) == 0) {
        // unexplored node
        NodeData child_data = DFS(child);
        result.lowlink = std::min(result.lowlink, child_data.lowlink);
      } else {
        NodeData child_data = cache_[child];
        if (child_data.scc == NULL) {
          // Still in the stack_ so we found a back edge
          result.lowlink = std::min(result.lowlink, child_data.index);
        }
      }
    }
  }
  if (result.index == result.lowlink) {
    // This is the root of a strongly connected component
    SCC* scc = CreateSCC();
    while (true) {
      const Descriptor* scc_desc = stack_.back();
      scc->descriptors.push_back(scc_desc);
      // Remove from stack
      stack_.pop_back();
      cache_[scc_desc].scc = scc;

      if (scc_desc == descriptor) break;
    }
  }
  return result;
}